

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

int pbrt::Log2Int(float v)

{
  uint uVar1;
  float in_XMM0_Da;
  uint32_t midsignif;
  float in_stack_fffffffffffffff0;
  int local_4;
  
  if (1.0 <= in_XMM0_Da) {
    local_4 = Exponent(0.0);
    uVar1 = Significand(0.0);
    local_4 = local_4 + (uint)(0x3504f2 < uVar1);
  }
  else {
    local_4 = Log2Int(in_stack_fffffffffffffff0);
    local_4 = -local_4;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
inline int Log2Int(float v) {
    DCHECK_GT(v, 0);
    if (v < 1)
        return -Log2Int(1 / v);
    // https://graphics.stanford.edu/~seander/bithacks.html#IntegerLog
    // (With an additional check of the significant to get round-to-nearest
    // rather than round down.)
    // midsignif = Significand(std::pow(2., 1.5))
    // i.e. grab the significand of a value halfway between two exponents,
    // in log space.
    const uint32_t midsignif = 0b00000000001101010000010011110011;
    return Exponent(v) + ((Significand(v) >= midsignif) ? 1 : 0);
}